

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QByteArray * QFileSystemEngine::id(QByteArray *__return_storage_ptr__,int fd)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_c8;
  stat64 statResult;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&statResult,0xaa,0x90);
  iVar2 = fstat64(fd,(stat64 *)&statResult);
  if (iVar2 == 0) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::number(__return_storage_ptr__,statResult.st_dev,0x10);
    QByteArray::append(__return_storage_ptr__,':');
    QByteArray::number((QByteArray *)&QStack_c8,statResult.st_ino,10);
    QByteArray::append(__return_storage_ptr__,(QByteArray *)&QStack_c8);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_c8);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0012a55f;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0012a55f:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QFileSystemEngine::id(int fd)
{
    QT_STATBUF statResult;
    if (QT_FSTAT(fd, &statResult)) {
        qErrnoWarning("fstat() failed for fd %d", fd);
        return QByteArray();
    }
    QByteArray result = QByteArray::number(quint64(statResult.st_dev), 16);
    result += ':';
    result += QByteArray::number(quint64(statResult.st_ino));
    return result;
}